

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_new.cc
# Opt level: O0

int ASN1_primitive_new(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  ASN1_OBJECT *pAVar1;
  ASN1_VALUE *pAVar2;
  ASN1_STRING *pAVar3;
  ASN1_TYPE *typ;
  int utype;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  
  if (it == (ASN1_ITEM *)0x0) {
    return 0;
  }
  if (it->tcount != 0) {
    __assert_fail("it->funcs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_new.cc"
                  ,0xda,"int ASN1_primitive_new(ASN1_VALUE **, const ASN1_ITEM *)");
  }
  if (it->itype == '\x05') {
    typ._4_4_ = -1;
  }
  else {
    typ._4_4_ = *(int *)&it->field_0x4;
  }
  switch(typ._4_4_) {
  case 1:
    *(int *)pval = (int)it->funcs;
    pval_local._4_4_ = 1;
    break;
  case 5:
    *pval = (ASN1_VALUE *)0x1;
    pval_local._4_4_ = 1;
    break;
  case 6:
    pAVar1 = OBJ_get_undef();
    *pval = (ASN1_VALUE *)pAVar1;
    pval_local._4_4_ = 1;
    break;
  case -4:
    pAVar2 = (ASN1_VALUE *)OPENSSL_malloc(0x10);
    if (pAVar2 == (ASN1_VALUE *)0x0) {
      return 0;
    }
    *(undefined8 *)(pAVar2 + 8) = 0;
    *(undefined4 *)pAVar2 = 0xffffffff;
    *pval = pAVar2;
    goto LAB_002f6526;
  default:
    pAVar3 = ASN1_STRING_type_new(typ._4_4_);
    *pval = (ASN1_VALUE *)pAVar3;
LAB_002f6526:
    if (*pval == (ASN1_VALUE *)0x0) {
      pval_local._4_4_ = 0;
    }
    else {
      pval_local._4_4_ = 1;
    }
  }
  return pval_local._4_4_;
}

Assistant:

static int ASN1_primitive_new(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  if (!it) {
    return 0;
  }

  // Historically, |it->funcs| for primitive types contained an
  // |ASN1_PRIMITIVE_FUNCS| table of calbacks.
  assert(it->funcs == NULL);

  int utype;
  if (it->itype == ASN1_ITYPE_MSTRING) {
    utype = -1;
  } else {
    utype = it->utype;
  }
  switch (utype) {
    case V_ASN1_OBJECT:
      *pval = (ASN1_VALUE *)OBJ_get_undef();
      return 1;

    case V_ASN1_BOOLEAN:
      *(ASN1_BOOLEAN *)pval = (ASN1_BOOLEAN)it->size;
      return 1;

    case V_ASN1_NULL:
      *pval = (ASN1_VALUE *)1;
      return 1;

    case V_ASN1_ANY: {
      ASN1_TYPE *typ =
          reinterpret_cast<ASN1_TYPE *>(OPENSSL_malloc(sizeof(ASN1_TYPE)));
      if (!typ) {
        return 0;
      }
      typ->value.ptr = NULL;
      typ->type = -1;
      *pval = (ASN1_VALUE *)typ;
      break;
    }

    default:
      *pval = (ASN1_VALUE *)ASN1_STRING_type_new(utype);
      break;
  }
  if (*pval) {
    return 1;
  }
  return 0;
}